

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SslSocket.cpp
# Opt level: O1

void __thiscall SslUdpSocketImpl::~SslUdpSocketImpl(SslUdpSocketImpl *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pcVar2;
  _Manager_type p_Var3;
  
  (this->super_UdpSocketImpl).super_BaseSocketImpl._vptr_BaseSocketImpl =
       (_func_int **)&PTR__SslUdpSocketImpl_00147fa0;
  pcVar2 = (this->m_strDestAddr)._M_dataplus._M_p;
  paVar1 = &(this->m_strDestAddr).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar2 != paVar1) {
    operator_delete(pcVar2,paVar1->_M_allocated_capacity + 1);
  }
  p_Var3 = (this->m_fSllInitDoneParam).super__Function_base._M_manager;
  if (p_Var3 != (_Manager_type)0x0) {
    (*p_Var3)((_Any_data *)&this->m_fSllInitDoneParam,(_Any_data *)&this->m_fSllInitDoneParam,
              __destroy_functor);
  }
  p_Var3 = (this->m_fSllInitDone).super__Function_base._M_manager;
  if (p_Var3 != (_Manager_type)0x0) {
    (*p_Var3)((_Any_data *)&this->m_fSllInitDone,(_Any_data *)&this->m_fSllInitDone,
              __destroy_functor);
  }
  std::
  unique_ptr<OpenSSLWrapper::SslConnection,_std::default_delete<OpenSSLWrapper::SslConnection>_>::
  ~unique_ptr(&this->m_pSslCon);
  OpenSSLWrapper::SslContext::~SslContext(&(this->m_pUdpCtx).super_SslContext);
  UdpSocketImpl::~UdpSocketImpl(&this->super_UdpSocketImpl);
  return;
}

Assistant:

SslUdpSocketImpl::~SslUdpSocketImpl()
{
}